

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

double __thiscall FixedSizeCache<double>::min(FixedSizeCache<double> *this)

{
  int iVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  runtime_error *this_00;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  
  iVar1 = this->_count;
  if ((long)iVar1 != 0) {
    pdVar5 = (this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar1 != 1) {
      dVar7 = *pdVar5;
      lVar4 = (long)iVar1 * 8 + -8;
      pdVar6 = pdVar5;
      do {
        pdVar6 = pdVar6 + 1;
        dVar2 = *pdVar6;
        pdVar3 = pdVar6;
        if (dVar7 <= *pdVar6) {
          dVar2 = dVar7;
          pdVar3 = pdVar5;
        }
        pdVar5 = pdVar3;
        dVar7 = dVar2;
        lVar4 = lVar4 + -8;
      } while (lVar4 != 0);
    }
    return *pdVar5;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"FixedSizeCache::min() called on empty cache");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }